

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void Fra_ClausAddToStorage(Clu_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int iVar4;
  long lVar5;
  int i;
  uint uVar6;
  
  piVar1 = p->vLits->pArray;
  uVar6 = 0;
  i = 0;
  iVar4 = 0;
  do {
    p_00 = p->vClauses;
    if (p_00->nSize <= i) {
      if (p->fVerbose != 0) {
        printf("Added to storage %d proved clauses (including %d one-hot clauses)\n",(ulong)uVar6,
               (ulong)(uint)p->nOneHotsProven);
        p_00 = p->vClauses;
      }
      p_00->nSize = 0;
      p->vLits->nSize = 0;
      p->vCosts->nSize = 0;
      p->nClauses = 0;
      p->fNothingNew = (uint)(uVar6 == 0);
      return;
    }
    iVar2 = Vec_IntEntry(p_00,i);
    iVar3 = Vec_IntEntry(p->vCosts,i);
    if (iVar3 != -1) {
      iVar3 = Vec_IntEntry(p->vCosts,i);
      if (iVar3 < 1) {
        __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x5aa,"void Fra_ClausAddToStorage(Clu_Man_t *)");
      }
      if (p->nLutSize < iVar2 - iVar4) {
        __assert_fail("End - Beg <= p->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x5ab,"void Fra_ClausAddToStorage(Clu_Man_t *)");
      }
      for (lVar5 = (long)iVar4; lVar5 < iVar2; lVar5 = lVar5 + 1) {
        Vec_IntPush(p->vLitsProven,piVar1[lVar5]);
      }
      Vec_IntPush(p->vClausesProven,p->vLitsProven->nSize);
      uVar6 = uVar6 + 1;
      if (i < p->nOneHots) {
        p->nOneHotsProven = p->nOneHotsProven + 1;
      }
    }
    i = i + 1;
    iVar4 = iVar2;
  } while( true );
}

Assistant:

void Fra_ClausAddToStorage( Clu_Man_t * p )
{
    int * pStart; 
    int Beg, End, Counter, i, k;
    Beg = 0;
    Counter = 0;
    pStart = Vec_IntArray( p->vLits );
    Vec_IntForEachEntry( p->vClauses, End, i )
    {
        if ( Vec_IntEntry( p->vCosts, i ) == -1 )
        {
            Beg = End;
            continue;
        }
        assert( Vec_IntEntry( p->vCosts, i ) > 0 );
        assert( End - Beg <= p->nLutSize );
        for ( k = Beg; k < End; k++ )
            Vec_IntPush( p->vLitsProven, pStart[k] );
        Vec_IntPush( p->vClausesProven, Vec_IntSize(p->vLitsProven) );
        Beg = End;
        Counter++;

        if ( i < p->nOneHots )
            p->nOneHotsProven++;
    }
    if ( p->fVerbose )
    printf( "Added to storage %d proved clauses (including %d one-hot clauses)\n", Counter, p->nOneHotsProven );

    Vec_IntClear( p->vClauses );
    Vec_IntClear( p->vLits );
    Vec_IntClear( p->vCosts );
    p->nClauses = 0;

    p->fNothingNew = (int)(Counter == 0);
}